

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O2

bool __thiscall
OPNMIDIplay::realTime_NoteOn(OPNMIDIplay *this,uint8_t channel,uint8_t note,uint8_t velocity)

{
  OPN_Operator *pOVar1;
  Phys *pPVar2;
  double dVar3;
  char cVar4;
  DebugMessageHook p_Var5;
  pointer pOVar6;
  int32_t aiVar7 [2];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint16_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  OPN2 *pOVar17;
  undefined6 uVar18;
  bool bVar19;
  notes_iterator nVar20;
  size_type sVar21;
  int64_t iVar22;
  Phys *pPVar23;
  long lVar24;
  uint8_t uVar25;
  uint uVar26;
  int iVar27;
  int32_t iVar28;
  undefined7 in_register_00000009;
  long lVar29;
  char *pcVar30;
  uint ccount_1;
  ulong uVar31;
  undefined7 in_register_00000031;
  bool bVar32;
  OpnInstMeta *pOVar33;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  uint32_t ccount;
  pointer pMVar34;
  OpnTimbre *a;
  byte bVar35;
  ulong c;
  uint ccount_2;
  int iVar36;
  float fVar37;
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar38;
  int32_t local_e0 [2];
  size_t bank;
  ulong local_d0;
  pointer local_c8;
  int32_t local_c0 [2];
  OPNMIDIplay *local_b8;
  OPN2 *local_b0;
  int local_a4;
  int32_t adlchannel [2];
  Phys voices [2];
  
  local_c0._1_7_ = 0;
  local_c0[0]._0_1_ = note;
  uVar26 = (uint)CONCAT71(in_register_00000009,velocity);
  local_b0 = (this->m_synth).m_p;
  aiVar7[0] = 0x7f;
  aiVar7[1] = 0;
  if (0x7e < note) {
    local_c0 = aiVar7;
  }
  uVar31 = CONCAT71(in_register_00000031,channel) & 0xffffffff;
  if (((uVar26 != 0) && (local_b0->m_musicMode == MODE_RSXX)) &&
     (nVar20 = MIDIchannel::find_activenote
                         ((this->m_midiChannels).
                          super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar31,local_c0[0]),
     ((nVar20.cell_)->super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).next !=
     (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)0x0)) {
    pOVar33 = ((nVar20.cell_)->value).ains;
    if (pOVar33 != (OpnInstMeta *)0x0) {
      iVar27 = (int)pOVar33->midiVelocityOffset + uVar26;
      iVar36 = 1;
      if (1 < iVar27) {
        iVar36 = iVar27;
      }
      uVar25 = '\x7f';
      if (iVar36 < 0x7f) {
        uVar25 = (uint8_t)iVar36;
      }
      ((nVar20.cell_)->value).vol = uVar25;
      noteUpdate(this,uVar31,nVar20,4,-1);
      return false;
    }
    uVar25 = '\x7f';
    if (uVar26 < 0x7f) {
      uVar25 = velocity;
    }
    ((nVar20.cell_)->value).vol = uVar25;
    return false;
  }
  bVar35 = channel & 0xf;
  if (uVar31 <= (ulong)(((long)(this->m_midiChannels).
                               super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_midiChannels).
                              super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x140)) {
    bVar35 = channel;
  }
  uVar31 = (ulong)bVar35;
  noteOff(this,uVar31,(uint8_t)local_c0[0],velocity != '\0');
  pOVar17 = local_b0;
  if (velocity == '\0') {
    return false;
  }
  pMVar34 = (this->m_midiChannels).
            super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_e0._1_7_ = 0;
  local_e0[0]._0_1_ = pMVar34[uVar31].patch;
  bVar32 = (bool)((bVar35 & 0xf) == 9 | pMVar34[uVar31].is_xg_percussion & 1U);
  bank = 0;
  bVar35 = pMVar34[uVar31].bank_msb;
  if ((bVar35 != 0 || pMVar34[uVar31].bank_lsb != '\0') &&
     (bank = (ulong)bVar35 << 8, (this->m_synthMode & 1) == 0)) {
    bank = (size_t)CONCAT11(bVar35,pMVar34[uVar31].bank_lsb);
  }
  pMVar34 = pMVar34 + uVar31;
  if (bVar32 != false) {
    lVar29 = 0;
    if ((this->m_synthMode & 2) != 0) {
      lVar29 = (ulong)(pMVar34->bank_msb == '~') << 7;
    }
    bank = lVar29 + (long)local_e0 + 0x8000;
    local_e0[0] = local_c0[0];
    local_e0[1] = local_c0[1];
  }
  if ((bank & 0x7fff) == 0) {
    pOVar33 = &OPN2::m_emptyInstrument;
    bVar19 = false;
    lVar29 = 0;
  }
  else {
    BasicBankMap<OPN2::Bank>::find((iterator *)voices,&local_b0->m_insBanks,bank);
    adlchannel = (int32_t  [2])
                 (pOVar17->m_insBanks).m_buckets.
                 super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
                 .m_p;
    bVar19 = BasicBankMap<OPN2::Bank>::iterator::operator!=
                       ((iterator *)voices,(iterator *)adlchannel);
    lVar29 = CONCAT62(voices[0].ains.OPS[1].data._1_6_,voices[0].ains.OPS._6_2_) + 0x18;
    if (bVar19) {
      pOVar33 = (OpnInstMeta *)((long)local_e0 * 0x4f + lVar29);
    }
    else {
      pOVar33 = &OPN2::m_emptyInstrument;
      lVar29 = 0;
    }
    bVar19 = !bVar19;
  }
  pOVar17 = local_b0;
  local_d0 = uVar31;
  if (((pOVar33->flags & 2) == 0) || ((bank & 0xffffffffffffff80) == bank)) {
    if (bVar19) goto LAB_0015498d;
  }
  else {
    BasicBankMap<OPN2::Bank>::find
              ((iterator *)voices,&local_b0->m_insBanks,bank & 0xffffffffffffff80);
    adlchannel = (int32_t  [2])
                 (pOVar17->m_insBanks).m_buckets.
                 super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
                 .m_p;
    bVar19 = BasicBankMap<OPN2::Bank>::iterator::operator!=
                       ((iterator *)voices,(iterator *)adlchannel);
    if (bVar19) {
      lVar29 = CONCAT62(voices[0].ains.OPS[1].data._1_6_,voices[0].ains.OPS._6_2_) + 0x18;
    }
    if (lVar29 == 0) {
      lVar29 = 0;
LAB_0015498d:
      uVar31 = local_d0;
      if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
        this_00 = &this->caugh_missing_banks_melodic;
        if (bVar32 != false) {
          this_00 = &this->caugh_missing_banks_percussion;
        }
        pVar38 = std::
                 _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::_M_insert_unique(&this_00->_M_t,&bank);
        uVar31 = local_d0;
        if (((undefined1  [16])pVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar30 = "melodic";
          if (bVar32 != false) {
            pcVar30 = "percussion";
          }
          (*(this->hooks).onDebugMessage)
                    ((this->hooks).onDebugMessage_userData,
                     "[%i] Playing missing %s MIDI bank %i (patch %i)",local_d0 & 0xffffffff,pcVar30
                     ,bank & 0xffffffffffff7fff,local_e0);
        }
      }
    }
    else {
      pOVar33 = (OpnInstMeta *)((long)local_e0 * 0x4f + lVar29);
      uVar31 = local_d0;
    }
  }
  pOVar17 = local_b0;
  if ((pOVar33->flags & 2) != 0) {
    local_c8 = pMVar34;
    BasicBankMap<OPN2::Bank>::find
              ((iterator *)voices,&local_b0->m_insBanks,(ulong)((uint)bank & 0x8000));
    uVar31 = local_d0;
    adlchannel = (int32_t  [2])
                 (pOVar17->m_insBanks).m_buckets.
                 super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
                 .m_p;
    bVar19 = BasicBankMap<OPN2::Bank>::iterator::operator!=
                       ((iterator *)voices,(iterator *)adlchannel);
    if (bVar19) {
      lVar29 = CONCAT62(voices[0].ains.OPS[1].data._1_6_,voices[0].ains.OPS._6_2_) + 0x18;
    }
    pMVar34 = local_c8;
    if (lVar29 != 0) {
      pOVar33 = (OpnInstMeta *)((long)local_e0 * 0x4f + lVar29);
    }
  }
  iVar27 = (int)pOVar33->midiVelocityOffset + uVar26;
  iVar36 = 1;
  if (1 < iVar27) {
    iVar36 = iVar27;
  }
  local_a4 = 0x7f;
  if (iVar36 < 0x7f) {
    local_a4 = iVar36;
  }
  if (((bVar32 == false) && (bank != 0)) && ((pOVar33->flags & 2) != 0)) {
    if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
      voices[0].chip_chan = (uint16_t)local_e0[0];
      uVar11 = voices[0].chip_chan;
      voices[0].ains.OPS[0].data._0_6_ = local_e0._2_6_;
      uVar18 = voices[0].ains.OPS[0].data._0_6_;
      sVar21 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               count(&this->caugh_missing_instruments,(key_type_conflict *)voices);
      if (sVar21 == 0) {
        (*(this->hooks).onDebugMessage)
                  ((this->hooks).onDebugMessage_userData,
                   "[%i] Caught a blank instrument %i (offset %i) in the MIDI bank %u",
                   uVar31 & 0xffffffff,(ulong)pMVar34->patch,local_e0,bank);
        uVar31 = local_d0;
        voices[0].chip_chan = uVar11;
        voices[0].ains.OPS[0].data._0_6_ = uVar18;
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_M_insert_unique(&(this->caugh_missing_instruments)._M_t,(value_type_conflict5 *)voices);
      }
    }
    bank = 0;
    local_e0._1_7_ = 0;
    local_e0[0]._0_1_ = pMVar34->patch;
  }
  bVar35 = pOVar33->drumTone;
  uVar26 = bVar35 - 0x80;
  if (-1 < (char)bVar35) {
    uVar26 = (uint)bVar35;
  }
  if (bVar35 == 0) {
    uVar26 = local_c0[0];
  }
  voices[0].chip_chan = 0;
  uVar8 = *(undefined8 *)pOVar33->op[0].OPS;
  uVar9 = *(undefined8 *)(pOVar33->op[0].OPS[1].data + 1);
  voices[0].ains.OPS._16_8_ = *(undefined8 *)(pOVar33->op[0].OPS[2].data + 2);
  voices[0].ains._24_8_ = *(undefined8 *)(pOVar33->op[0].OPS[3].data + 3);
  voices[0].ains.OPS[0].data._0_6_ = (undefined6)uVar8;
  voices[0].ains.OPS._6_2_ = (undefined2)((ulong)uVar8 >> 0x30);
  voices[0].ains.OPS[1].data._1_6_ = (undefined6)uVar9;
  voices[0].ains.OPS[2].data._0_2_ = (undefined2)((ulong)uVar9 >> 0x30);
  voices[1].chip_chan = 0;
  voices[1].ains.OPS._0_8_ = *(undefined8 *)pOVar33->op[1].OPS;
  voices[1].ains.OPS._8_8_ = *(undefined8 *)(pOVar33->op[1].OPS[1].data + 1);
  voices[1].ains.OPS._16_8_ = *(undefined8 *)(pOVar33->op[1].OPS[2].data + 2);
  voices[1].ains._24_8_ = *(undefined8 *)(pOVar33->op[1].OPS[3].data + 3);
  bVar35 = pOVar33->flags & 2;
  if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
    adlchannel[0] = local_e0[0];
    adlchannel[1] = local_e0[1];
    sVar21 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             count(&this->caugh_missing_instruments,(key_type_conflict *)adlchannel);
    if ((sVar21 == 0) && (bVar35 != 0)) {
      (*(this->hooks).onDebugMessage)
                ((this->hooks).onDebugMessage_userData,"[%i] Playing missing instrument %i",
                 uVar31 & 0xffffffff,local_e0);
      adlchannel[0] = local_e0[0];
      adlchannel[1] = local_e0[1];
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_insert_unique(&(this->caugh_missing_instruments)._M_t,(value_type_conflict5 *)adlchannel)
      ;
      goto LAB_00154c76;
    }
  }
  if (bVar35 == 0) {
    adlchannel[0] = -1;
    adlchannel[1] = -1;
    lVar29 = 0;
    local_c8 = pMVar34;
    local_b8 = this;
    while( true ) {
      a = &voices[0].ains;
      if (lVar29 == 2) break;
      iVar28 = adlchannel[0];
      if (lVar29 == 1) {
        bVar19 = operator==(a,&voices[1].ains);
        if ((bVar19) || (iVar28 = adlchannel[0], adlchannel[0] == -1)) break;
      }
      iVar36 = -0x7fffffff;
      uVar31 = 0xffffffffffffffff;
      for (c = 0; c < local_b0->m_numChannels; c = c + 1) {
        if ((lVar29 != 1) || (iVar28 != (int)c)) {
          iVar22 = calculateChipChannelGoodness(local_b8,c,(Phys *)&voices[lVar29].chip_chan);
          if (iVar36 < iVar22) {
            uVar31 = c;
          }
          uVar31 = uVar31 & 0xffffffff;
          if (iVar36 < iVar22) {
            iVar36 = (int)iVar22;
          }
        }
      }
      if ((int)uVar31 < 0) {
        p_Var5 = (local_b8->hooks).onDebugMessage;
        if (p_Var5 != (DebugMessageHook)0x0) {
          (*p_Var5)((local_b8->hooks).onDebugMessage_userData,
                    "ignored unplaceable note [bank %i, inst %i, note %i, MIDI channel %i]",bank,
                    (ulong)local_c8->patch,local_c0,local_d0);
        }
      }
      else {
        prepareChipChannelForNewNote(local_b8,uVar31 & 0xffffffff,(Phys *)&voices[lVar29].chip_chan)
        ;
        adlchannel[lVar29] = (int)uVar31;
      }
      lVar29 = lVar29 + 1;
    }
    bVar19 = -1 < (adlchannel[1] & adlchannel[0]);
    if (bVar19) {
      uVar25 = (uint8_t)local_a4;
      if (local_c8->softPedal == true) {
        fVar37 = floorf((float)(int)(char)(uint8_t)local_a4 * 0.8);
        uVar25 = (uint8_t)(int)fVar37;
      }
      aiVar7 = local_c0;
      pMVar34 = local_c8;
      nVar20 = MIDIchannel::ensure_find_or_create_activenote(local_c8,local_c0[0]);
      ((nVar20.cell_)->value).vol = uVar25;
      ((nVar20.cell_)->value).vibrato = pMVar34->noteAftertouch[(long)aiVar7];
      ((nVar20.cell_)->value).noteTone = (int16_t)uVar26;
      ((nVar20.cell_)->value).currentTone = (double)(int)uVar26;
      ((nVar20.cell_)->value).glideRate = INFINITY;
      ((nVar20.cell_)->value).midiins = (size_t)local_e0;
      ((nVar20.cell_)->value).isPercussion = bVar32;
      ((nVar20.cell_)->value).isBlank = false;
      ((nVar20.cell_)->value).isOnExtendedLifeTime = false;
      ((nVar20.cell_)->value).ttl = 0.0;
      ((nVar20.cell_)->value).ains = pOVar33;
      ((nVar20.cell_)->value).chip_channels_count = 0;
      cVar4 = pMVar34->portamentoSource;
      dVar3 = pMVar34->portamentoRate;
      pMVar34->portamentoSource = (int8_t)aiVar7[0];
      if ((byte)((bVar32 ^ 1U) & -1 < cVar4 & dVar3 < INFINITY & pMVar34->portamentoEnable) == 1) {
        ((nVar20.cell_)->value).currentTone = (double)(int)cVar4;
        ((nVar20.cell_)->value).glideRate = dVar3;
        local_c8->gliding_note_count = local_c8->gliding_note_count + 1;
      }
      if (bVar32 != false) {
        ((nVar20.cell_)->value).ttl = 0.03;
        local_c8->extended_note_count = local_c8->extended_note_count + 1;
      }
      for (lVar29 = 0; lVar29 != 2; lVar29 = lVar29 + 1) {
        if (-1 < adlchannel[lVar29]) {
          pPVar23 = MIDIchannel::NoteInfo::phys_ensure_find_or_create
                              (&(nVar20.cell_)->value,(uint16_t)adlchannel[lVar29]);
          uVar8 = *(undefined8 *)(a->OPS[1].data + 1);
          uVar9 = *(undefined8 *)(a->OPS[2].data + 2);
          uVar10 = *(undefined8 *)(a->OPS[3].data + 3);
          *(undefined8 *)(pPVar23->ains).OPS = *(undefined8 *)a->OPS;
          *(undefined8 *)((pPVar23->ains).OPS[1].data + 1) = uVar8;
          *(undefined8 *)((pPVar23->ains).OPS[2].data + 2) = uVar9;
          *(undefined8 *)((pPVar23->ains).OPS[3].data + 3) = uVar10;
        }
        a = (OpnTimbre *)((long)(a + 1) + 2);
      }
      noteUpdate(local_b8,local_d0,nVar20,0xf,-1);
      pPVar23 = voices;
      for (lVar29 = 0; lVar29 != 2; lVar29 = lVar29 + 1) {
        lVar24 = (long)adlchannel[lVar29];
        if (-1 < lVar24) {
          pOVar6 = (local_b8->m_chipChannels).
                   super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pOVar6[lVar24].recent_ins.ains.noteOffset = (pPVar23->ains).noteOffset;
          uVar11 = pPVar23->chip_chan;
          uVar25 = (pPVar23->ains).OPS[0].data[0];
          uVar12 = (pPVar23->ains).OPS[0].data[1];
          uVar13 = (pPVar23->ains).OPS[0].data[2];
          uVar14 = (pPVar23->ains).OPS[0].data[3];
          uVar15 = (pPVar23->ains).OPS[0].data[4];
          uVar16 = (pPVar23->ains).OPS[0].data[5];
          uVar8 = *(undefined8 *)((pPVar23->ains).OPS[0].data + 6);
          uVar9 = *(undefined8 *)((pPVar23->ains).OPS[3].data + 1);
          pOVar1 = pOVar6[lVar24].recent_ins.ains.OPS + 2;
          *(undefined8 *)pOVar1 = *(undefined8 *)((pPVar23->ains).OPS + 2);
          *(undefined8 *)(pOVar1[1].data + 1) = uVar9;
          pPVar2 = &pOVar6[lVar24].recent_ins;
          pPVar2->chip_chan = uVar11;
          (pPVar2->ains).OPS[0].data[0] = uVar25;
          (pPVar2->ains).OPS[0].data[1] = uVar12;
          (pPVar2->ains).OPS[0].data[2] = uVar13;
          (pPVar2->ains).OPS[0].data[3] = uVar14;
          (pPVar2->ains).OPS[0].data[4] = uVar15;
          (pPVar2->ains).OPS[0].data[5] = uVar16;
          *(undefined8 *)((pPVar2->ains).OPS[0].data + 6) = uVar8;
          OpnChannel::addAge((local_b8->m_chipChannels).
                             super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar24,0);
        }
        pPVar23 = pPVar23 + 1;
      }
      return bVar19;
    }
    return bVar19;
  }
LAB_00154c76:
  aiVar7 = local_c0;
  nVar20 = MIDIchannel::ensure_find_or_create_activenote(pMVar34,local_c0[0]);
  ((nVar20.cell_)->value).isBlank = true;
  ((nVar20.cell_)->value).isOnExtendedLifeTime = false;
  ((nVar20.cell_)->value).chip_channels_count = 0;
  ((nVar20.cell_)->value).ttl = 0.0;
  ((nVar20.cell_)->value).ains = (OpnInstMeta *)0x0;
  pMVar34->portamentoSource = (int8_t)aiVar7[0];
  return false;
}

Assistant:

bool OPNMIDIplay::realTime_NoteOn(uint8_t channel, uint8_t note, uint8_t velocity)
{
    Synth &synth = *m_synth;

    if(note >= 127)
        note = 127;

    if((synth.m_musicMode == Synth::MODE_RSXX) && (velocity != 0))
    {
        // Check if this is just a note after-touch
        MIDIchannel::notes_iterator i = m_midiChannels[channel].find_activenote(note);
        if(!i.is_end())
        {
            MIDIchannel::NoteInfo &ni = i->value;
            const int veloffset = ni.ains ? ni.ains->midiVelocityOffset : 0;
            velocity = static_cast<uint8_t>(std::min(127, std::max(1, static_cast<int>(velocity) + veloffset)));
            ni.vol = velocity;
            if(ni.ains)
                noteUpdate(channel, i, Upd_Volume);
            return false;
        }
    }

    if(static_cast<size_t>(channel) > m_midiChannels.size())
        channel = channel % 16;
    noteOff(channel, note, velocity != 0);
    // On Note on, Keyoff the note first, just in case keyoff
    // was omitted; this fixes Dance of sugar-plum fairy
    // by Microsoft. Now that we've done a Keyoff,
    // check if we still need to do a Keyon.
    // vol=0 and event 8x are both Keyoff-only.
    if(velocity == 0)
        return false;

    MIDIchannel &midiChan = m_midiChannels[channel];

    size_t midiins = midiChan.patch;
    bool isPercussion = (channel % 16 == 9) || midiChan.is_xg_percussion;

    size_t bank = 0;
    if(midiChan.bank_msb || midiChan.bank_lsb)
    {
        if((m_synthMode & Mode_GS) != 0) //in GS mode ignore LSB
            bank = (midiChan.bank_msb * 256);
        else
            bank = (midiChan.bank_msb * 256) + midiChan.bank_lsb;
    }

    if(isPercussion)
    {
        // == XG bank numbers ==
        // 0x7E00 - XG "SFX Kits" SFX1/SFX2 channel (16128 signed decimal)
        // 0x7F00 - XG "Drum Kits" Percussion channel (16256 signed decimal)

        // MIDI instrument defines the patch:
        if((m_synthMode & Mode_XG) != 0)
        {
            // Let XG SFX1/SFX2 bank will go in 128...255 range of LSB in WOPN file)
            // Let XG Percussion bank will use (0...127 LSB range in WOPN file)

            // Choose: SFX or Drum Kits
            bank = midiins + ((midiChan.bank_msb == 0x7E) ? 128 : 0);
        }
        else
        {
            bank = midiins;
        }
        midiins = note; // Percussion instrument
    }

    if(isPercussion)
        bank += Synth::PercussionTag;

    const OpnInstMeta *ains = &Synth::m_emptyInstrument;

    //Set bank bank
    const Synth::Bank *bnk = NULL;
    bool caughtMissingBank = false;
    if((bank & ~static_cast<uint16_t>(Synth::PercussionTag)) > 0)
    {
        Synth::BankMap::iterator b = synth.m_insBanks.find(bank);
        if(b != synth.m_insBanks.end())
            bnk = &b->second;
        if(bnk)
            ains = &bnk->ins[midiins];
        else
            caughtMissingBank = true;
    }

    //Or fall back to bank ignoring LSB (GS/XG)
    if(ains->flags & OpnInstMeta::Flag_NoSound)
    {
        size_t fallback = bank & ~(size_t)0x7F;
        if(fallback != bank)
        {
            Synth::BankMap::iterator b = synth.m_insBanks.find(fallback);
            caughtMissingBank = false;
            if(b != synth.m_insBanks.end())
                bnk = &b->second;
            if(bnk)
                ains = &bnk->ins[midiins];
            else
                caughtMissingBank = true;
        }
    }

    if(caughtMissingBank && hooks.onDebugMessage)
    {
        std::set<size_t> &missing = (isPercussion) ?
                                    caugh_missing_banks_percussion : caugh_missing_banks_melodic;
        const char *text = (isPercussion) ?
                           "percussion" : "melodic";
        if(missing.insert(bank).second)
        {
            hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                 "[%i] Playing missing %s MIDI bank %i (patch %i)",
                                 channel, text, (bank & ~static_cast<uint16_t>(Synth::PercussionTag)), midiins);
        }
    }

    //Or fall back to first bank
    if((ains->flags & OpnInstMeta::Flag_NoSound) != 0)
    {
        Synth::BankMap::iterator b = synth.m_insBanks.find(bank & Synth::PercussionTag);
        if(b != synth.m_insBanks.end())
            bnk = &b->second;
        if(bnk)
            ains = &bnk->ins[midiins];
    }

    const int veloffset = ains->midiVelocityOffset;
    velocity = static_cast<uint8_t>(std::min(127, std::max(1, static_cast<int>(velocity) + veloffset)));

    int32_t tone = note;
    if(!isPercussion && (bank > 0)) // For non-zero banks
    {
        if(ains->flags & OpnInstMeta::Flag_NoSound)
        {
            if(hooks.onDebugMessage)
            {
                if(!caugh_missing_instruments.count(static_cast<uint8_t>(midiins)))
                {
                    hooks.onDebugMessage(hooks.onDebugMessage_userData, "[%i] Caught a blank instrument %i (offset %i) in the MIDI bank %u", channel, midiChan.patch, midiins, bank);
                    caugh_missing_instruments.insert(static_cast<uint8_t>(midiins));
                }
            }
            bank = 0;
            midiins = midiChan.patch;
        }
    }

    if(ains->drumTone)
    {
        if(ains->drumTone >= 128)
            tone = ains->drumTone - 128;
        else
            tone = ains->drumTone;
    }

    MIDIchannel::NoteInfo::Phys voices[MIDIchannel::NoteInfo::MaxNumPhysChans] = {
        {0, ains->op[0], /*false*/},
        {0, ains->op[1], /*pseudo_4op*/},
    };
    //bool pseudo_4op = ains.flags & opnInstMeta::Flag_Pseudo8op;
    //if((opn.AdlPercussionMode == 1) && PercussionMap[midiins & 0xFF]) i[1] = i[0];

    bool isBlankNote = (ains->flags & OpnInstMeta::Flag_NoSound) != 0;

    if(hooks.onDebugMessage)
    {
        if(!caugh_missing_instruments.count(static_cast<uint8_t>(midiins)) && isBlankNote)
        {
            hooks.onDebugMessage(hooks.onDebugMessage_userData, "[%i] Playing missing instrument %i", channel, midiins);
            caugh_missing_instruments.insert(static_cast<uint8_t>(midiins));
        }
    }

    if(isBlankNote)
    {
        // Don't even try to play the blank instrument! But, insert the dummy note.
        MIDIchannel::notes_iterator i = midiChan.ensure_find_or_create_activenote(note);
        MIDIchannel::NoteInfo &dummy = i->value;
        dummy.isBlank = true;
        dummy.isOnExtendedLifeTime = false;
        dummy.ttl = 0;
        dummy.ains = NULL;
        dummy.chip_channels_count = 0;
        // Record the last note on MIDI channel as source of portamento
        midiChan.portamentoSource = static_cast<int8_t>(note);
        return false;
    }

    // Allocate OPN2 channel (the physical sound channel for the note)
    int32_t adlchannel[MIDIchannel::NoteInfo::MaxNumPhysChans] = { -1, -1 };

    for(uint32_t ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        if(ccount == 1)
        {
            if(voices[0] == voices[1])
                break; // No secondary channel
            if(adlchannel[0] == -1)
                break; // No secondary if primary failed
        }

        int32_t c = -1;
        int32_t bs = -0x7FFFFFFFl;

        for(size_t a = 0; a < static_cast<size_t>(synth.m_numChannels); ++a)
        {
            if(ccount == 1 && static_cast<int32_t>(a) == adlchannel[0]) continue;
            // ^ Don't use the same channel for primary&secondary
            // ===== Kept for future pseudo-8-op mode
            //if(voices[0] == voices[1] || pseudo_4op)
            //{
            //    // Only use regular channels
            //    uint8_t expected_mode = 0;
            //    if(opn.AdlPercussionMode == 1)
            //    {
            //        if(cmf_percussion_mode)
            //            expected_mode = MidCh < 11 ? 0 : (3 + MidCh - 11); // CMF
            //        else
            //            expected_mode = PercussionMap[midiins & 0xFF];
            //    }
            //    if(opn.four_op_category[a] != expected_mode)
            //        continue;
            //}
            int64_t s = calculateChipChannelGoodness(a, voices[ccount]);
            if(s > bs)
            {
                bs = static_cast<int32_t>(s);    // Best candidate wins
                c = static_cast<int32_t>(a);
            }
        }

        if(c < 0)
        {
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                     "ignored unplaceable note [bank %i, inst %i, note %i, MIDI channel %i]",
                                     bank, midiChan.patch, note, channel);
            continue; // Could not play this note. Ignore it.
        }

        prepareChipChannelForNewNote(static_cast<size_t>(c), voices[ccount]);
        adlchannel[ccount] = c;
    }

    if(adlchannel[0] < 0 && adlchannel[1] < 0)
    {
        // The note could not be played, at all.
        return false;
    }

    //if(hooks.onDebugMessage)
    //    hooks.onDebugMessage(hooks.onDebugMessage_userData, "i1=%d:%d, i2=%d:%d", i[0],adlchannel[0], i[1],adlchannel[1]);

    if(midiChan.softPedal) // Apply Soft Pedal level reducing
        velocity = static_cast<uint8_t>(std::floor(static_cast<float>(velocity) * 0.8f));

    // Allocate active note for MIDI channel
    MIDIchannel::notes_iterator ir = midiChan.ensure_find_or_create_activenote(note);
    MIDIchannel::NoteInfo &ni = ir->value;
    ni.vol     = velocity;
    ni.vibrato = midiChan.noteAftertouch[note];
    ni.noteTone = static_cast<int16_t>(tone);
    ni.currentTone = tone;
    ni.glideRate = HUGE_VAL;
    ni.midiins = midiins;
    ni.isPercussion = isPercussion;
    ni.isBlank = isBlankNote;
    ni.isOnExtendedLifeTime = false;
    ni.ttl = 0;
    ni.ains = ains;
    ni.chip_channels_count = 0;

    int8_t currentPortamentoSource = midiChan.portamentoSource;
    double currentPortamentoRate = midiChan.portamentoRate;
    bool portamentoEnable =
        midiChan.portamentoEnable && currentPortamentoRate != HUGE_VAL && !isPercussion;
    // Record the last note on MIDI channel as source of portamento
    midiChan.portamentoSource = static_cast<int8_t>(note);
    // midiChan.portamentoSource = portamentoEnable ? (int8_t)note : (int8_t)-1;

    // Enable gliding on portamento note
    if (portamentoEnable && currentPortamentoSource >= 0)
    {
        ni.currentTone = currentPortamentoSource;
        ni.glideRate = currentPortamentoRate;
        ++midiChan.gliding_note_count;
    }

    // Enable life time extension on percussion note
    if (isPercussion)
    {
        ni.ttl = drum_note_min_time;
        ++midiChan.extended_note_count;
    }

    for(unsigned ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        int32_t c = adlchannel[ccount];
        if(c < 0)
            continue;
        uint16_t chipChan = static_cast<uint16_t>(adlchannel[ccount]);
        ni.phys_ensure_find_or_create(chipChan)->assign(voices[ccount]);
    }

    noteUpdate(channel, ir, Upd_All | Upd_Patch);

    for(unsigned ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        int32_t c = adlchannel[ccount];
        if(c < 0)
            continue;
        m_chipChannels[c].recent_ins = voices[ccount];
        m_chipChannels[c].addAge(0);
    }

    return true;
}